

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O0

int64_t __thiscall AutoFile::tell(AutoFile *this)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  long *plVar4;
  long in_FS_OFFSET;
  optional<long> *in_stack_ffffffffffffff98;
  io_errc in_stack_ffffffffffffffa4;
  error_code *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::optional<long>::has_value(in_stack_ffffffffffffff98);
  if (bVar2) {
    plVar4 = std::optional<long>::operator*(in_stack_ffffffffffffff98);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return *plVar4;
    }
  }
  else {
    pcVar3 = (char *)__cxa_allocate_exception(0x20);
    std::error_code::error_code<std::io_errc,void>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar3,(error_code *)"AutoFile::tell: position unknown");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  __stack_chk_fail();
}

Assistant:

int64_t AutoFile::tell()
{
    if (!m_position.has_value()) throw std::ios_base::failure("AutoFile::tell: position unknown");
    return *m_position;
}